

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::WriteJson_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Value *value)

{
  Value *pVVar1;
  Value *in_RCX;
  allocator<char> local_f1;
  String local_f0;
  Value local_d0;
  allocator<char> local_a1;
  String local_a0;
  Value local_70;
  undefined1 local_48 [8];
  StreamWriterBuilder writer;
  Value *value_local;
  
  writer.settings_.limit_ = (ptrdiff_t)this;
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_48);
  Json::Value::Value(&local_70,"  ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"indentation",&local_a1);
  pVVar1 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_48,&local_a0);
  Json::Value::operator=(pVVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_d0,"None");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"commentStyle",&local_f1);
  pVVar1 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_48,&local_f0);
  Json::Value::operator=(pVVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  Json::Value::~Value(&local_d0);
  Json::writeString_abi_cxx11_
            (__return_storage_ptr__,(Json *)local_48,(Factory *)writer.settings_.limit_,in_RCX);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string WriteJson(const Json::Value& value)
{
  Json::StreamWriterBuilder writer;
  writer["indentation"] = "  ";
  writer["commentStyle"] = "None";
  return Json::writeString(writer, value);
}